

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS
ref_node_bounding_sphere(REF_NODE ref_node,REF_INT *nodes,REF_INT n,REF_DBL *center,REF_DBL *radius)

{
  REF_DBL *pRVar1;
  long lVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  REF_DBL RVar6;
  
  lVar2 = 0;
  do {
    center[lVar2] = 0.0;
    if (0 < n) {
      pRVar1 = ref_node->real;
      RVar6 = center[lVar2];
      uVar3 = 0;
      do {
        RVar6 = RVar6 + pRVar1[(long)nodes[uVar3] * 0xf + (long)(int)lVar2];
        center[lVar2] = RVar6;
        uVar3 = uVar3 + 1;
      } while ((uint)n != uVar3);
    }
    center[lVar2] = center[lVar2] / (double)n;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  *radius = 0.0;
  if (0 < n) {
    uVar3 = 0;
    do {
      dVar5 = *radius;
      pRVar1 = ref_node->real;
      lVar2 = (long)nodes[uVar3];
      dVar4 = (pRVar1[lVar2 * 0xf + 2] - center[2]) * (pRVar1[lVar2 * 0xf + 2] - center[2]) +
              (pRVar1[lVar2 * 0xf + 1] - center[1]) * (pRVar1[lVar2 * 0xf + 1] - center[1]) +
              (pRVar1[lVar2 * 0xf] - *center) * (pRVar1[lVar2 * 0xf] - *center);
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      if (dVar5 <= dVar4) {
        pRVar1 = ref_node->real;
        lVar2 = (long)nodes[uVar3];
        dVar5 = (pRVar1[lVar2 * 0xf + 2] - center[2]) * (pRVar1[lVar2 * 0xf + 2] - center[2]) +
                (pRVar1[lVar2 * 0xf + 1] - center[1]) * (pRVar1[lVar2 * 0xf + 1] - center[1]) +
                (pRVar1[lVar2 * 0xf] - *center) * (pRVar1[lVar2 * 0xf] - *center);
        if (dVar5 < 0.0) {
          RVar6 = sqrt(dVar5);
        }
        else {
          RVar6 = SQRT(dVar5);
        }
      }
      else {
        RVar6 = *radius;
      }
      *radius = RVar6;
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_bounding_sphere(REF_NODE ref_node, REF_INT *nodes,
                                            REF_INT n, REF_DBL *center,
                                            REF_DBL *radius) {
  REF_INT i, j;
  for (i = 0; i < 3; i++) {
    center[i] = 0;
    for (j = 0; j < n; j++) {
      center[i] += ref_node_xyz(ref_node, i, nodes[j]);
    }
    center[i] /= (REF_DBL)n;
  }
  *radius = 0.0;
  for (i = 0; i < n; i++)
    *radius = MAX(
        *radius, sqrt(pow(ref_node_xyz(ref_node, 0, nodes[i]) - center[0], 2) +
                      pow(ref_node_xyz(ref_node, 1, nodes[i]) - center[1], 2) +
                      pow(ref_node_xyz(ref_node, 2, nodes[i]) - center[2], 2)));
  return REF_SUCCESS;
}